

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

Pipeline * __thiscall
n_e_s::core::Mos6502::create_absolute_indexed_addressing_steps
          (Pipeline *__return_storage_ptr__,Mos6502 *this,uint8_t *index_reg,MemoryAccess access)

{
  anon_class_8_1_8991fb9c local_158;
  StepT local_150;
  anon_class_8_1_8991fb9c local_130;
  StepT local_128;
  anon_class_8_1_8991fb9c local_108;
  StepT local_100;
  anon_class_8_1_8991fb9c local_e0;
  ConditionalStepT local_d8;
  anon_class_8_1_8991fb9c local_b8;
  StepT local_b0;
  anon_class_16_2_354eec14 local_90;
  StepT local_80;
  anon_class_8_1_8991fb9c local_50;
  StepT local_48;
  undefined1 local_25;
  MemoryAccess local_24;
  uint8_t *puStack_20;
  MemoryAccess access_local;
  uint8_t *index_reg_local;
  Mos6502 *this_local;
  Pipeline *result;
  
  local_25 = 0;
  local_24 = access;
  puStack_20 = index_reg;
  index_reg_local = (uint8_t *)this;
  this_local = (Mos6502 *)__return_storage_ptr__;
  Pipeline::Pipeline(__return_storage_ptr__);
  local_50.this = this;
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_absolute_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__0,void>
            ((function<void()> *)&local_48,&local_50);
  Pipeline::push(__return_storage_ptr__,&local_48);
  std::function<void_()>::~function(&local_48);
  local_90.index_reg = puStack_20;
  local_90.this = this;
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_absolute_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__1,void>
            ((function<void()> *)&local_80,&local_90);
  Pipeline::push(__return_storage_ptr__,&local_80);
  std::function<void_()>::~function(&local_80);
  if (local_24 == Write) {
    local_b8.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_absolute_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__2,void>
              ((function<void()> *)&local_b0,&local_b8);
    Pipeline::push(__return_storage_ptr__,&local_b0);
    std::function<void_()>::~function(&local_b0);
  }
  else if (local_24 == Read) {
    local_e0.this = this;
    std::function<n_e_s::core::StepResult()>::
    function<n_e_s::core::Mos6502::create_absolute_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__3,void>
              ((function<n_e_s::core::StepResult()> *)&local_d8,&local_e0);
    Pipeline::push_conditional(__return_storage_ptr__,&local_d8);
    std::function<n_e_s::core::StepResult_()>::~function(&local_d8);
  }
  else {
    local_108.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_absolute_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__4,void>
              ((function<void()> *)&local_100,&local_108);
    Pipeline::push(__return_storage_ptr__,&local_100);
    std::function<void_()>::~function(&local_100);
    local_130.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_absolute_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__5,void>
              ((function<void()> *)&local_128,&local_130);
    Pipeline::push(__return_storage_ptr__,&local_128);
    std::function<void_()>::~function(&local_128);
    local_158.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_absolute_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__6,void>
              ((function<void()> *)&local_150,&local_158);
    Pipeline::push(__return_storage_ptr__,&local_150);
    std::function<void_()>::~function(&local_150);
  }
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_absolute_indexed_addressing_steps(
        const uint8_t *index_reg,
        const MemoryAccess access) {
    Pipeline result;
    result.push([this] { tmp_ = mmu_->read_byte(registers_->pc++); });
    result.push([this, index_reg] {
        const uint16_t address_high = mmu_->read_byte(registers_->pc++) << 8u;
        const uint16_t abs_address = address_high | tmp_;
        const uint8_t offset = *index_reg;

        is_crossing_page_boundary_ = cross_page(abs_address, offset);
        effective_address_ = abs_address + offset;
    });

    if (access == MemoryAccess::Write) {
        result.push([this] {
            if (is_crossing_page_boundary_) {
                // The high byte of the effective address is invalid
                // at this time (smaller by $100), but a read is still
                // performed.
                mmu_->read_byte(
                        effective_address_ - static_cast<uint16_t>(0x0100));
            } else {
                // Extra read from effective address.
                mmu_->read_byte(effective_address_);
            }
        });
    } else if (access == MemoryAccess::Read) {
        result.push_conditional([this] {
            if (is_crossing_page_boundary_) {
                // The high byte of the effective address is invalid
                // at this time (smaller by $100), but a read is still
                // performed.
                mmu_->read_byte(
                        effective_address_ - static_cast<uint16_t>(0x0100));
                return StepResult::Continue;
            }
            return StepResult::Skip;
        });
    } else {
        result.push([this] {
            if (is_crossing_page_boundary_) {
                // The high byte of the effective address is invalid
                // at this time (smaller by $100), but a read is still
                // performed.
                mmu_->read_byte(
                        effective_address_ - static_cast<uint16_t>(0x0100));
            } else {
                // Extra read from effective address.
                mmu_->read_byte(effective_address_);
            }
        });
        result.push([this] {
            // Extra read from effective address.
            tmp_ = mmu_->read_byte(effective_address_);
        });
        result.push([this] {
            // Extra write.
            mmu_->write_byte(effective_address_, tmp_);
        });
    }
    return result;
}